

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltcalc.cpp
# Opt level: O3

void eltcalc::GetEventRates<occurrence_granular>(occurrence_granular *occ,FILE *fin)

{
  float fVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  const_iterator __pos;
  _Base_ptr p_Var8;
  ulong uVar9;
  FILE *__stream;
  float *pfVar10;
  FILE *__k;
  int iVar11;
  ulong uVar12;
  undefined1 *__ptr;
  bool bVar13;
  int no_of_periods;
  tuple<> tStack_79;
  _Head_base<0UL,_const_float_&,_false> _Stack_78;
  double dStack_70;
  int iStack_64;
  FILE *pFStack_60;
  ulong uStack_58;
  occurrence_granular *poStack_50;
  uint *puStack_48;
  code *pcStack_40;
  double local_38;
  uint local_2c;
  
  __ptr = (undefined1 *)&local_2c;
  local_2c = 0;
  pcStack_40 = (code *)0x1034c8;
  fread(__ptr,4,1,(FILE *)fin);
  __stream = (FILE *)0x10;
  pcStack_40 = (code *)0x1034dd;
  sVar5 = fread(occ,0x10,1,(FILE *)fin);
  uVar4 = local_2c;
  uVar9 = (ulong)local_2c;
  if (sVar5 == 0) {
    uVar12 = 0;
  }
  else {
    local_38 = 1.0 / (double)(int)local_2c;
    uVar12 = 0;
    __ptr = event_rate_;
    do {
      pcStack_40 = (code *)0x10350f;
      pmVar6 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)event_rate_,&occ->event_id);
      *pmVar6 = *pmVar6 + local_38;
      if ((int)uVar12 <= occ->period_no) {
        uVar12 = (ulong)(uint)occ->period_no;
      }
      __stream = (FILE *)0x10;
      pcStack_40 = (code *)0x10353c;
      sVar5 = fread(occ,0x10,1,(FILE *)fin);
    } while (sVar5 != 0);
  }
  pcStack_40 = (code *)0x10354e;
  __k = fin;
  fclose((FILE *)fin);
  if ((int)uVar12 <= (int)uVar4) {
    return;
  }
  pcStack_40 = GetEventRates<occurrence>;
  GetEventRates<occurrence_granular>();
  iStack_64 = 0;
  _Stack_78._M_head_impl = (float *)0x103598;
  pFStack_60 = fin;
  uStack_58 = uVar12;
  poStack_50 = occ;
  puStack_48 = (uint *)__ptr;
  pcStack_40 = (code *)uVar9;
  fread(&iStack_64,4,1,__stream);
  pfVar10 = (float *)0xc;
  _Stack_78._M_head_impl = (float *)0x1035ad;
  sVar5 = fread(__k,0xc,1,__stream);
  iVar3 = iStack_64;
  if (sVar5 == 0) {
    iVar11 = 0;
  }
  else {
    dStack_70 = 1.0 / (double)iStack_64;
    iVar11 = 0;
    do {
      _Stack_78._M_head_impl = (float *)0x1035df;
      pmVar6 = std::map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
               ::operator[]((map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                             *)event_rate_,(key_type *)__k);
      *pmVar6 = *pmVar6 + dStack_70;
      if (iVar11 <= *(int *)(__k + 4)) {
        iVar11 = *(int *)(__k + 4);
      }
      pfVar10 = (float *)0xc;
      _Stack_78._M_head_impl = (float *)0x10360c;
      sVar5 = fread(__k,0xc,1,__stream);
    } while (sVar5 != 0);
  }
  _Stack_78._M_head_impl = (float *)0x10361e;
  fclose(__stream);
  if (iVar3 < iVar11) {
    _Stack_78._M_head_impl = (float *)0x103635;
    GetEventRates<occurrence>();
    p_Var8 = (_Base_ptr)__stream->_IO_read_end;
    __pos._M_node = (_Base_ptr)&__stream->_IO_read_ptr;
    if (p_Var8 != (_Base_ptr)0x0) {
      fVar1 = *pfVar10;
      p_Var7 = __pos._M_node;
      do {
        bVar13 = fVar1 != (float)p_Var8[1]._M_color;
        bVar2 = (float)p_Var8[1]._M_color <= fVar1;
        if (!bVar2 || !bVar13) {
          p_Var7 = p_Var8;
        }
        p_Var8 = (&p_Var8->_M_left)[bVar2 && bVar13];
      } while (p_Var8 != (_Base_ptr)0x0);
      bVar13 = p_Var7 != __pos._M_node;
      __pos._M_node = p_Var7;
      if ((bVar13) && ((float)p_Var7[1]._M_color <= fVar1)) {
        return;
      }
    }
    _Stack_78._M_head_impl = pfVar10;
    std::
    _Rb_tree<float,std::pair<float_const,interval>,std::_Select1st<std::pair<float_const,interval>>,std::less<float>,std::allocator<std::pair<float_const,interval>>>
    ::
    _M_emplace_hint_unique<std::piecewise_construct_t_const&,std::tuple<float_const&>,std::tuple<>>
              ((_Rb_tree<float,std::pair<float_const,interval>,std::_Select1st<std::pair<float_const,interval>>,std::less<float>,std::allocator<std::pair<float_const,interval>>>
                *)__stream,__pos,(piecewise_construct_t *)&std::piecewise_construct,
               (tuple<const_float_&> *)&_Stack_78,&tStack_79);
    return;
  }
  return;
}

Assistant:

void GetEventRates(T &occ, FILE * fin)
	{
		// Calculate event rates from occurrence file
		int max_period_no = 0;
		int no_of_periods = 0;
		size_t i = fread(&no_of_periods, sizeof(no_of_periods), 1, fin);
		i = fread(&occ, sizeof(occ), 1, fin);
		while (i != 0) {
			event_rate_[occ.event_id] += 1 / (double)no_of_periods;
			if (max_period_no < occ.period_no)
				max_period_no = occ.period_no;
			i = fread(&occ, sizeof(occ), 1, fin);
		}
		fclose(fin);

		if (max_period_no > no_of_periods) {
			fprintf(stderr, "FATAL: Maximum period number in occurrence file exceeds that in header.\n");
			exit(EXIT_FAILURE);
		}
	}